

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmSourceFile *source;
  bool bVar1;
  TargetType TVar2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar3;
  char *pcVar4;
  reference ppcVar5;
  mapped_type *this_02;
  string local_1a8;
  LocalObjectEntry local_188;
  mapped_type *local_160;
  LocalObjectInfo *info;
  undefined1 local_138 [8];
  string objectName;
  bool hasSourceExtension;
  cmSourceFile *sf;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_100;
  iterator si;
  undefined1 local_d8 [8];
  string dir;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  cmGeneratorTarget *gt;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_38;
  iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *localObjectFiles_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  __x = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,__x);
  local_38._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
  while( true ) {
    gt = (cmGeneratorTarget *)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                        *)&gt);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_38);
    this_00 = *ppcVar3;
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (TVar2 != INTERFACE_LIBRARY) {
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_70);
      this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b0,"CMAKE_BUILD_TYPE",
                 (allocator *)(dir.field_2._M_local_buf + 0xf));
      pcVar4 = cmMakefile::GetSafeDefinition(this_01,&local_b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_90,pcVar4,(allocator *)(dir.field_2._M_local_buf + 0xe));
      cmGeneratorTarget::GetObjectSources
                (this_00,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                         local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xe));
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)local_d8);
      pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(this_00->LocalGenerator);
      std::__cxx11::string::operator+=((string *)local_d8,pcVar4);
      std::__cxx11::string::operator+=((string *)local_d8,"/");
      (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xb])
                (&si,this,this_00);
      std::__cxx11::string::operator+=((string *)local_d8,(string *)&si);
      std::__cxx11::string::~string((string *)&si);
      std::__cxx11::string::operator+=((string *)local_d8,"/");
      local_100._M_current =
           (cmSourceFile **)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_70);
      while( true ) {
        sf = (cmSourceFile *)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        local_70);
        bVar1 = __gnu_cxx::operator!=
                          (&local_100,
                           (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                            *)&sf);
        if (!bVar1) break;
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                  ::operator*(&local_100);
        source = *ppcVar5;
        objectName.field_2._M_local_buf[0xf] = '\x01';
        cmLocalGenerator::GetObjectFileNameWithoutTarget
                  ((string *)local_138,(cmLocalGenerator *)this,source,(string *)local_d8,
                   (bool *)(objectName.field_2._M_local_buf + 0xf));
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar4);
        if (bVar1) {
          cmsys::SystemTools::GetFilenameName((string *)&info,(string *)local_138);
          std::__cxx11::string::operator=((string *)local_138,(string *)&info);
          std::__cxx11::string::~string((string *)&info);
        }
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                  ::operator[](localObjectFiles,(key_type *)local_138);
        this_02->HasSourceExtension = (bool)(objectName.field_2._M_local_buf[0xf] & 1);
        local_160 = this_02;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_1a8,source);
        LocalObjectEntry::LocalObjectEntry(&local_188,this_00,&local_1a8);
        std::
        vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
        ::push_back(&this_02->
                     super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                    ,&local_188);
        LocalObjectEntry::~LocalObjectEntry(&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)local_138);
        __gnu_cxx::
        __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
        ::operator++(&local_100);
      }
      std::__cxx11::string::~string((string *)local_d8);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_70);
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_38);
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::
GetLocalObjectFiles(std::map<std::string, LocalObjectInfo> &localObjectFiles)
{
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  for(std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
      ti != targets.end(); ++ti)
    {
    cmGeneratorTarget* gt = *ti;
    if (gt->GetType() == cmState::INTERFACE_LIBRARY)
      {
      continue;
      }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, this->Makefile
                                    ->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    // Compute full path to object file directory for this target.
    std::string dir;
    dir += gt->LocalGenerator->GetCurrentBinaryDirectory();
    dir += "/";
    dir += this->GetTargetDirectory(gt);
    dir += "/";
    // Compute the name of each object file.
    for(std::vector<cmSourceFile const*>::iterator
          si = objectSources.begin();
        si != objectSources.end(); ++si)
      {
      cmSourceFile const* sf = *si;
      bool hasSourceExtension = true;
      std::string objectName = this->GetObjectFileNameWithoutTarget(*sf,
                                                                    dir,
                                                        &hasSourceExtension);
      if(cmSystemTools::FileIsFullPath(objectName.c_str()))
        {
        objectName = cmSystemTools::GetFilenameName(objectName);
        }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.push_back(LocalObjectEntry(gt, sf->GetLanguage()));
      }
    }
}